

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

_Bool f64_addsub_post(union_float64 a,union_float64 b)

{
  double dVar1;
  int local_30;
  bool local_29;
  int local_1c;
  union_float64 b_local;
  union_float64 a_local;
  
  local_1c = 2;
  if (((a.h != 0.0) || (NAN(a.h))) && (local_1c = 0, !NAN(a.h))) {
    dVar1 = ABS(a.h);
    local_1c = 1;
    if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_1c = 3, 2.2250738585072014e-308 <= dVar1)) {
      local_1c = 4;
    }
  }
  local_29 = false;
  if (local_1c == 2) {
    local_30 = 2;
    if (((b.h != 0.0) || (NAN(b.h))) && (local_30 = 0, !NAN(b.h))) {
      dVar1 = ABS(b.h);
      local_30 = 1;
      if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_30 = 3, 2.2250738585072014e-308 <= dVar1))
      {
        local_30 = 4;
      }
    }
    local_29 = local_30 == 2;
  }
  return (_Bool)((local_29 ^ 0xffU) & 1);
}

Assistant:

static bool f64_addsub_post(union_float64 a, union_float64 b)
{
    if (QEMU_HARDFLOAT_2F64_USE_FP) {
        return !(fpclassify(a.h) == FP_ZERO && fpclassify(b.h) == FP_ZERO);
    } else {
        return !(float64_is_zero(a.s) && float64_is_zero(b.s));
    }
}